

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O2

int cuddZddSiftingBackward(DdManager *table,Move *moves,int size)

{
  int iVar1;
  Move *pMVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = -1;
  iVar1 = 0;
  for (pMVar2 = moves; iVar4 = iVar3, pMVar2 != (Move *)0x0; pMVar2 = pMVar2->next) {
    if (pMVar2->size < size) {
      iVar3 = iVar1;
      size = pMVar2->size;
    }
    iVar1 = iVar1 + 1;
  }
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (iVar4 == 0) {
      return 1;
    }
    iVar1 = cuddZddSwapInPlace(table,moves->x,moves->y);
    if (iVar1 == 0) {
      return 0;
    }
    if ((iVar3 == -1) && (iVar1 == size)) break;
    moves = moves->next;
    iVar4 = iVar4 + -1;
  }
  return 1;
}

Assistant:

static int
cuddZddSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    int         i;
    int         i_best;
    Move        *move;
    int         res;

    /* Find the minimum size among moves. */
    i_best = -1;
    for (move = moves, i = 0; move != NULL; move = move->next, i++) {
        if (move->size < size) {
            i_best = i;
            size = move->size;
        }
    }

    for (move = moves, i = 0; move != NULL; move = move->next, i++) {
        if (i == i_best)
            break;
        res = cuddZddSwapInPlace(table, move->x, move->y);
        if (!res)
            return(0);
        if (i_best == -1 && res == size)
            break;
    }

    return(1);

}